

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O0

void bcf_enc_size(kstring_t *s,int size,int type)

{
  undefined2 local_1e;
  int32_t local_1c;
  int iStack_18;
  int16_t x_1;
  int32_t x;
  int type_local;
  int size_local;
  kstring_t *s_local;
  
  iStack_18 = type;
  x = size;
  _type_local = s;
  if (size < 0xf) {
    kputc(size << 4 | type,s);
  }
  else {
    kputc(type | 0xf0,s);
    if (x < 0x80) {
      kputc(0x11,_type_local);
      kputc(x,_type_local);
    }
    else if (x < 0x8000) {
      local_1e = (undefined2)x;
      kputc(0x12,_type_local);
      kputsn((char *)&local_1e,2,_type_local);
    }
    else {
      local_1c = x;
      kputc(0x13,_type_local);
      kputsn((char *)&local_1c,4,_type_local);
    }
  }
  return;
}

Assistant:

static inline void bcf_enc_size(kstring_t *s, int size, int type)
{
    if (size >= 15) {
        kputc(15<<4|type, s);
        if (size >= 128) {
            if (size >= 32768) {
                int32_t x = size;
                kputc(1<<4|BCF_BT_INT32, s);
                kputsn((char*)&x, 4, s);
            } else {
                int16_t x = size;
                kputc(1<<4|BCF_BT_INT16, s);
                kputsn((char*)&x, 2, s);
            }
        } else {
            kputc(1<<4|BCF_BT_INT8, s);
            kputc(size, s);
        }
    } else kputc(size<<4|type, s);
}